

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::CommandLineInterface::ExpandArgumentFile
          (CommandLineInterface *this,char *file,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments)

{
  char cVar1;
  istream *piVar2;
  string argument;
  string file_str;
  ifstream file_stream;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&file_str,file,(allocator<char> *)&file_stream);
  std::ifstream::ifstream(&file_stream,file_str._M_dataplus._M_p,_S_in);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    argument._M_dataplus._M_p = (pointer)&argument.field_2;
    argument._M_string_length = 0;
    argument.field_2._M_local_buf[0] = '\0';
    while( true ) {
      piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&file_stream,(string *)&argument);
      if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(arguments,&argument);
    }
    std::__cxx11::string::~string((string *)&argument);
  }
  std::ifstream::~ifstream(&file_stream);
  std::__cxx11::string::~string((string *)&file_str);
  return (bool)cVar1;
}

Assistant:

bool CommandLineInterface::ExpandArgumentFile(
    const char* file, std::vector<std::string>* arguments) {
// On windows to force ifstream to handle proper utr-8, we need to convert to
// proper supported utf8 wstring. If we dont then the file can't be opened.
#ifdef _MSC_VER
  // Convert the file name to wide chars.
  int size = MultiByteToWideChar(CP_UTF8, 0, file, strlen(file), nullptr, 0);
  std::wstring file_str;
  file_str.resize(size);
  MultiByteToWideChar(CP_UTF8, 0, file, strlen(file), &file_str[0],
                      file_str.size());
#else
  std::string file_str(file);
#endif

  // The argument file is searched in the working directory only. We don't
  // use the proto import path here.
  std::ifstream file_stream(file_str.c_str());
  if (!file_stream.is_open()) {
    return false;
  }
  std::string argument;
  // We don't support any kind of shell expansion right now.
  while (std::getline(file_stream, argument)) {
    arguments->push_back(argument);
  }
  return true;
}